

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O3

char * helicsFederateWaitCommand(HelicsFederate fed,HelicsError *err)

{
  FedObject *pFVar1;
  _Alloc_hider _Var2;
  string *this;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  res;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  
  pFVar1 = helics::getFedObject(fed,err);
  _Var2 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
  if (pFVar1 != (FedObject *)0x0) {
    helics::Federate::waitCommand_abi_cxx11_
              (&local_50,
               (pFVar1->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    if (local_50.first._M_string_length == 0) {
      this = &gHelicsEmptyStr_abi_cxx11_;
    }
    else {
      this = &(pFVar1->commandBuffer).first;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (this,&local_50.first);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&(pFVar1->commandBuffer).second,&local_50.second);
    }
    _Var2._M_p = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &this->_M_dataplus)->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.second._M_dataplus._M_p != &local_50.second.field_2) {
      operator_delete(local_50.second._M_dataplus._M_p,
                      local_50.second.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.first._M_dataplus._M_p != &local_50.first.field_2) {
      operator_delete(local_50.first._M_dataplus._M_p,
                      local_50.first.field_2._M_allocated_capacity + 1);
    }
  }
  return _Var2._M_p;
}

Assistant:

const char* helicsFederateWaitCommand(HelicsFederate fed, HelicsError* err)
{
    auto* fedObj = helics::getFedObject(fed, err);

    if (fedObj == nullptr) {
        return gHelicsEmptyStr.c_str();
    }
    auto res = fedObj->fedptr->waitCommand();
    if (res.first.empty()) {
        return gHelicsEmptyStr.c_str();
    }
    fedObj->commandBuffer = std::move(res);
    return fedObj->commandBuffer.first.c_str();
}